

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,timestamp_t *rdata,date_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  DateTruncBinaryOperator *pDVar2;
  char *pcVar3;
  date_t dVar4;
  timestamp_t tVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  unsigned_long uVar10;
  ulong uVar11;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pDVar2 = *(DateTruncBinaryOperator **)&ldata->value;
      pcVar3 = (ldata->value).pointer.ptr;
      iVar9 = 0;
      tVar5.value = count;
      do {
        specifier_01.value.pointer.ptr = (char *)rdata[iVar9].value;
        specifier_01.value._0_8_ = pcVar3;
        dVar4 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                          (pDVar2,specifier_01,tVar5);
        result_data[iVar9].days = dVar4.days;
        iVar9 = iVar9 + 1;
        tVar5.value = (int64_t)result_data;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[uVar6];
      }
      uVar11 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar11 = count;
      }
      uVar8 = uVar11;
      if (uVar10 != 0) {
        uVar8 = uVar7;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar7 < uVar11) {
            pDVar2 = *(DateTruncBinaryOperator **)&ldata->value;
            pcVar3 = (ldata->value).pointer.ptr;
            tVar5.value = uVar6;
            do {
              specifier.value.pointer.ptr = (char *)rdata[uVar8].value;
              specifier.value._0_8_ = pcVar3;
              dVar4 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (pDVar2,specifier,tVar5);
              result_data[uVar8].days = dVar4.days;
              uVar8 = uVar8 + 1;
            } while (uVar11 != uVar8);
          }
        }
        else if (uVar7 < uVar11) {
          uVar8 = 0;
          tVar5.value = uVar6;
          do {
            if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)rdata[uVar7 + uVar8].value;
              specifier_00.value._0_8_ = (ldata->value).pointer.ptr;
              dVar4 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)&ldata->value,specifier_00,tVar5);
              result_data[uVar7 + uVar8].days = dVar4.days;
            }
            uVar8 = uVar8 + 1;
          } while ((uVar7 - uVar11) + uVar8 != 0);
          uVar8 = uVar7 + uVar8;
        }
      }
      uVar6 = uVar6 + 1;
      uVar7 = uVar8;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}